

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O1

int __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  bool bVar3;
  int iVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  uint *puVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  long lVar12;
  byte bVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  int local_1b4;
  cpp_dec_float<200U,_int,_void> local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar13 = 0;
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  if (pSVar2->sparsePricingLeave != true) {
    pnVar1 = &(this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thetolerance;
    pnVar9 = pnVar1;
    pcVar10 = &local_130;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pcVar10->data)._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
      pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((pnVar9->m_backend).data._M_elems + 1);
      pcVar10 = (cpp_dec_float<200U,_int,_void> *)((pcVar10->data)._M_elems + 1);
    }
    local_130.exp =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.exp;
    local_130.neg =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.neg;
    local_130.fpclass =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.fpclass;
    local_130.prec_elem =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.prec_elem;
    if (local_130.fpclass != cpp_dec_float_finite || local_130.data._M_elems[0] != 0) {
      local_130.neg = (bool)(local_130.neg ^ 1);
    }
    lVar6 = (long)(pSVar2->thecovectors->set).thenum;
    if (lVar6 < 1) {
      local_1b4 = -1;
    }
    else {
      lVar12 = lVar6 * 0x80 + -8;
      local_1b4 = -1;
      do {
        puVar5 = (undefined8 *)
                 ((long)&(((((this->
                             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).thesolver)->theCoTest).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar12);
        puVar8 = (uint *)(puVar5 + -0xf);
        pcVar10 = &local_1b0;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pcVar10->data)._M_elems[0] = *puVar8;
          puVar8 = puVar8 + (ulong)bVar13 * -2 + 1;
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar13 * -8 + 4);
        }
        local_1b0.exp = *(int *)(puVar5 + -1);
        local_1b0.neg = *(bool *)((long)puVar5 + -4);
        local_1b0._120_8_ = *puVar5;
        pnVar9 = pnVar1;
        pcVar10 = &local_b0;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pcVar10->data)._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
          pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar9 + (ulong)bVar13 * -8 + 4);
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar13 * -8 + 4);
        }
        local_b0.exp = (this->
                       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thetolerance.m_backend.exp;
        local_b0.neg = (this->
                       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thetolerance.m_backend.neg;
        local_b0.fpclass =
             (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.fpclass;
        local_b0.prec_elem =
             (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.prec_elem;
        if (local_b0.data._M_elems[0] != 0 || local_b0.fpclass != cpp_dec_float_finite) {
          local_b0.neg = (bool)(local_b0.neg ^ 1);
        }
        if ((((local_b0.fpclass != cpp_dec_float_NaN && local_1b0.fpclass != cpp_dec_float_NaN) &&
             (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&local_1b0,&local_b0), iVar4 < 0)) &&
            (local_1b0.fpclass != cpp_dec_float_NaN)) &&
           ((local_130.fpclass != cpp_dec_float_NaN &&
            (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_1b0,&local_130), iVar4 < 0)))) {
          pcVar10 = &local_1b0;
          pcVar11 = &local_130;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pcVar11->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar13 * -8 + 4);
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar11 + ((ulong)bVar13 * -2 + 1) * 4);
          }
          local_130.exp = local_1b0.exp;
          local_130.neg = local_1b0.neg;
          local_130.fpclass = local_1b0.fpclass;
          local_130.prec_elem = local_1b0.prec_elem;
          local_1b4 = (int)lVar6 + -1;
        }
        lVar12 = lVar12 + -0x80;
        bVar3 = 1 < lVar6;
        lVar6 = lVar6 + -1;
      } while (bVar3);
    }
    return local_1b4;
  }
  iVar4 = selectLeaveSparse(this);
  return iVar4;
}

Assistant:

int SPxDantzigPR<R>::selectLeave()
{
   assert(this->thesolver != nullptr);

   if(this->thesolver->sparsePricingLeave)
      return selectLeaveSparse();

   //    const R* up  = this->thesolver->ubBound();
   //    const R* low = this->thesolver->lbBound();

   R best = -this->thetolerance;
   int  n    = -1;

   for(int i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      R x = this->thesolver->fTest()[i];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            n    = i;
            best = x;
         }
      }
   }

   return n;
}